

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Nbget_field(int g_a,int *lo,int *hi,int foff,int fsize,void *buf,int *ld,
                    ga_nbhdl_t *nbhandle)

{
  long lVar1;
  long lVar2;
  Integer _ld [7];
  Integer _ahi [7];
  Integer _alo [7];
  
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _alo[lVar2 + -1] = (long)*lo + 1;
      lo = lo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _ahi[lVar2 + -1] = (long)*hi + 1;
      hi = hi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (1 < lVar1) {
    do {
      _ld[lVar1 + -2] = (long)*ld + 1;
      lVar1 = lVar1 + -1;
      ld = ld + 1;
    } while (lVar1 != 1);
  }
  pnga_nbget_field((long)g_a,_alo,_ahi,(long)foff,(long)fsize,buf,_ld,nbhandle);
  return;
}

Assistant:

void NGA_Nbget_field(int g_a, int *lo, int *hi, int foff, int fsize,
		     void *buf, int *ld, ga_nbhdl_t *nbhandle) {
  Integer a = (Integer)g_a;
  Integer andim = wnga_ndim(a);
  Integer _alo[MAXDIM], _ahi[MAXDIM];
  Integer _ld[MAXDIM];
  COPYINDEX_C2F(lo,_alo, andim);
  COPYINDEX_C2F(hi,_ahi, andim);
  COPYINDEX_C2F(ld, _ld, andim-1);

  wnga_nbget_field(a, _alo, _ahi, foff, fsize, buf, _ld, (Integer*)nbhandle);
}